

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O3

void pospopcnt_u32_sse_harley_seal_improved(uint32_t *array,size_t len,uint32_t *flags)

{
  undefined1 auVar1 [16];
  size_t i;
  ulong uVar2;
  int j;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  undefined1 (*pauVar7) [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  uint32_t auVar42 [4];
  undefined1 auVar43 [64];
  uint32_t auVar44 [4];
  undefined1 auVar45 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  uint32_t auVar51 [4];
  undefined1 auVar52 [64];
  uint32_t auVar53 [4];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 auVar56 [64];
  undefined1 in_ZMM19 [64];
  undefined1 auVar57 [64];
  undefined1 in_ZMM20 [64];
  undefined1 auVar58 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 auVar59 [64];
  uint32_t buffer [4];
  
  uVar2 = len & 0xffffffffffffffc0;
  if (uVar2 != len) {
    do {
      lVar3 = 0;
      do {
        flags[lVar3] = flags[lVar3] + (uint)((array[uVar2] >> ((uint)lVar3 & 0x1f) & 1) != 0);
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x20);
      uVar2 = uVar2 + 1;
    } while (uVar2 < len);
  }
  auVar1 = _DAT_0011a1d0;
  uVar2 = len >> 2 & 0x3ffffffffffffff0;
  if (uVar2 == 0) {
    auVar42[0] = 0;
    auVar42[1] = 0;
    auVar42[2] = 0;
    auVar42[3] = 0;
    auVar44[0] = 0;
    auVar44[1] = 0;
    auVar44[2] = 0;
    auVar44[3] = 0;
    auVar51[0] = 0;
    auVar51[1] = 0;
    auVar51[2] = 0;
    auVar51[3] = 0;
    auVar53[0] = 0;
    auVar53[1] = 0;
    auVar53[2] = 0;
    auVar53[3] = 0;
  }
  else {
    auVar27 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
    auVar28 = vmovdqu64_avx512f(*(undefined1 (*) [64])(flags + 0x10));
    auVar46[8] = 0x55;
    auVar46._0_8_ = 0x5555555555555555;
    auVar46[9] = 0x55;
    auVar46[10] = 0x55;
    auVar46[0xb] = 0x55;
    auVar46[0xc] = 0x55;
    auVar46[0xd] = 0x55;
    auVar46[0xe] = 0x55;
    auVar46[0xf] = 0x55;
    auVar47[8] = 1;
    auVar47._0_8_ = 0x101010101010101;
    auVar47[9] = 1;
    auVar47[10] = 1;
    auVar47[0xb] = 1;
    auVar47[0xc] = 1;
    auVar47[0xd] = 1;
    auVar47[0xe] = 1;
    auVar47[0xf] = 1;
    auVar48._8_2_ = 0x3333;
    auVar48._0_8_ = 0x3333333333333333;
    auVar48._10_2_ = 0x3333;
    auVar48._12_2_ = 0x3333;
    auVar48._14_2_ = 0x3333;
    auVar49._8_2_ = 1;
    auVar49._0_8_ = 0x1000100010001;
    auVar49._10_2_ = 1;
    auVar49._12_2_ = 1;
    auVar49._14_2_ = 1;
    auVar50._8_4_ = 0xf;
    auVar50._0_8_ = 0xf0000000f;
    auVar50._12_4_ = 0xf;
    auVar8 = vpbroadcastd_avx512vl(ZEXT416(0xf0));
    auVar59 = ZEXT1664(auVar8);
    auVar29 = vpmovsxbd_avx512f(_DAT_0011a1e0);
    auVar30 = vpmovsxbd_avx512f(_DAT_0011a1f0);
    auVar31 = vpmovsxbd_avx512f(_DAT_0011a200);
    auVar32 = vpmovsxbd_avx512f(_DAT_0011a210);
    auVar33 = vpmovsxbq_avx512f(ZEXT816(0x408020100));
    auVar34 = vpmovsxbd_avx512f(_DAT_0011a220);
    auVar35 = vpmovsxbd_avx512f(_DAT_0011a130);
    auVar54 = ZEXT1664((undefined1  [16])0x0);
    auVar52 = ZEXT1664((undefined1  [16])0x0);
    auVar45 = ZEXT1664((undefined1  [16])0x0);
    auVar43 = ZEXT1664((undefined1  [16])0x0);
    auVar55 = ZEXT1664((undefined1  [16])0x0);
    uVar4 = 0;
    do {
      uVar6 = uVar4 + 0xffff;
      if (uVar2 - uVar4 < 0x10000) {
        uVar6 = uVar2;
      }
      auVar8 = in_ZMM16._0_16_;
      auVar15 = in_ZMM17._0_16_;
      auVar12 = in_ZMM22._0_16_;
      auVar13 = in_ZMM18._0_16_;
      auVar14 = in_ZMM19._0_16_;
      auVar26 = in_ZMM20._0_16_;
      auVar17 = in_ZMM23._0_16_;
      auVar16 = in_ZMM21._0_16_;
      if (uVar4 < uVar6) {
        auVar9 = vpxord_avx512vl(auVar8,auVar8);
        auVar10 = vpxord_avx512vl(auVar15,auVar15);
        auVar11 = vpxord_avx512vl(auVar12,auVar12);
        auVar12 = vpxord_avx512vl(auVar13,auVar13);
        auVar13 = vpxord_avx512vl(auVar14,auVar14);
        auVar8 = vpxord_avx512vl(auVar26,auVar26);
        auVar14 = vpxord_avx512vl(auVar17,auVar17);
        auVar15 = vpxord_avx512vl(auVar16,auVar16);
        auVar29 = vmovdqa64_avx512f(auVar29);
        pauVar7 = (undefined1 (*) [16])(array + uVar4 * 4 + 0x3c);
        do {
          auVar16 = vmovdqu64_avx512vl(pauVar7[-0xf]);
          auVar17 = vmovdqu64_avx512vl(pauVar7[-0xe]);
          auVar18 = vmovdqu64_avx512vl(pauVar7[-0xd]);
          auVar19 = vmovdqu64_avx512vl(pauVar7[-0xc]);
          auVar26 = vpshufb_avx(auVar55._0_16_,auVar1);
          uVar4 = uVar4 + 0x10;
          auVar20 = vpxorq_avx512vl(auVar16,auVar54._0_16_);
          auVar21 = vpandq_avx512vl(auVar20,auVar17);
          auVar16 = vpternlogq_avx512vl(auVar21,auVar16,auVar54._0_16_,0xf8);
          auVar17 = vpxorq_avx512vl(auVar20,auVar17);
          auVar20 = vpxorq_avx512vl(auVar17,auVar18);
          auVar21 = vpandq_avx512vl(auVar20,auVar19);
          auVar17 = vpternlogq_avx512vl(auVar21,auVar17,auVar18,0xf8);
          auVar18 = vpxorq_avx512vl(auVar20,auVar19);
          auVar19 = vpxorq_avx512vl(auVar16,auVar52._0_16_);
          auVar20 = vpandq_avx512vl(auVar17,auVar19);
          auVar16 = vpternlogq_avx512vl(auVar20,auVar16,auVar52._0_16_,0xf8);
          auVar17 = vpxorq_avx512vl(auVar17,auVar19);
          auVar19 = vmovdqu64_avx512vl(pauVar7[-0xb]);
          auVar20 = vmovdqu64_avx512vl(pauVar7[-10]);
          auVar21 = vpxorq_avx512vl(auVar18,auVar19);
          auVar22 = vpandq_avx512vl(auVar21,auVar20);
          auVar18 = vpternlogq_avx512vl(auVar22,auVar18,auVar19,0xf8);
          auVar19 = vmovdqu64_avx512vl(pauVar7[-9]);
          auVar20 = vpxorq_avx512vl(auVar21,auVar20);
          auVar21 = vmovdqu64_avx512vl(pauVar7[-8]);
          auVar22 = vpxorq_avx512vl(auVar20,auVar19);
          auVar23 = vpandq_avx512vl(auVar22,auVar21);
          auVar19 = vpternlogq_avx512vl(auVar23,auVar20,auVar19,0xf8);
          auVar20 = vpxorq_avx512vl(auVar18,auVar17);
          auVar21 = vpxorq_avx512vl(auVar22,auVar21);
          auVar22 = vpxorq_avx512vl(auVar16,auVar45._0_16_);
          auVar23 = vpandq_avx512vl(auVar19,auVar20);
          auVar17 = vpternlogq_avx512vl(auVar23,auVar18,auVar17,0xf8);
          auVar18 = vpxorq_avx512vl(auVar19,auVar20);
          auVar19 = vpandq_avx512vl(auVar17,auVar22);
          auVar16 = vpternlogq_avx512vl(auVar19,auVar16,auVar45._0_16_,0xf8);
          auVar17 = vpxorq_avx512vl(auVar17,auVar22);
          auVar19 = vmovdqu64_avx512vl(pauVar7[-7]);
          auVar20 = vmovdqu64_avx512vl(pauVar7[-6]);
          auVar22 = vpxorq_avx512vl(auVar21,auVar19);
          auVar23 = vpandq_avx512vl(auVar22,auVar20);
          auVar19 = vpternlogq_avx512vl(auVar23,auVar21,auVar19,0xf8);
          auVar21 = vmovdqu64_avx512vl(pauVar7[-5]);
          auVar20 = vpxorq_avx512vl(auVar22,auVar20);
          auVar22 = vmovdqu64_avx512vl(pauVar7[-4]);
          auVar23 = vpxorq_avx512vl(auVar20,auVar21);
          auVar24 = vpandq_avx512vl(auVar23,auVar22);
          auVar20 = vpternlogq_avx512vl(auVar24,auVar20,auVar21,0xf8);
          auVar21 = vpxorq_avx512vl(auVar19,auVar18);
          auVar22 = vpxorq_avx512vl(auVar23,auVar22);
          auVar23 = vmovdqu64_avx512vl(pauVar7[-2]);
          auVar24 = vpandq_avx512vl(auVar20,auVar21);
          auVar18 = vpternlogq_avx512vl(auVar24,auVar19,auVar18,0xf8);
          auVar19 = vpxorq_avx512vl(auVar20,auVar21);
          auVar20 = vmovdqu64_avx512vl(pauVar7[-3]);
          auVar21 = vpxorq_avx512vl(auVar22,auVar20);
          auVar24 = vpandq_avx512vl(auVar21,auVar23);
          auVar20 = vpternlogq_avx512vl(auVar24,auVar22,auVar20,0xf8);
          auVar22 = vmovdqu64_avx512vl(pauVar7[-1]);
          auVar21 = vpxorq_avx512vl(auVar21,auVar23);
          auVar23 = vmovdqu64_avx512vl(*pauVar7);
          pauVar7 = pauVar7 + 0x10;
          auVar24 = vpxorq_avx512vl(auVar21,auVar22);
          auVar25 = vpandq_avx512vl(auVar24,auVar23);
          auVar21 = vpternlogq_avx512vl(auVar25,auVar21,auVar22,0xf8);
          auVar22 = vpxorq_avx512vl(auVar20,auVar19);
          auVar23 = vpxorq_avx512vl(auVar24,auVar23);
          auVar54 = ZEXT1664(auVar23);
          auVar23 = vpandq_avx512vl(auVar21,auVar22);
          auVar19 = vpternlogq_avx512vl(auVar23,auVar20,auVar19,0xf8);
          auVar20 = vpxorq_avx512vl(auVar21,auVar22);
          auVar52 = ZEXT1664(auVar20);
          auVar20 = vpxorq_avx512vl(auVar18,auVar17);
          auVar21 = vpandq_avx512vl(auVar19,auVar20);
          auVar17 = vpternlogq_avx512vl(auVar21,auVar18,auVar17,0xf8);
          auVar18 = vpxorq_avx512vl(auVar19,auVar20);
          auVar45 = ZEXT1664(auVar18);
          auVar18 = vpsrld_avx512vl(auVar26,1);
          auVar26 = vpand_avx(auVar26,auVar46);
          auVar18 = vpandq_avx512vl(auVar18,auVar46);
          auVar26 = vpmaddubsw_avx(auVar26,auVar47);
          auVar18 = vpmaddubsw_avx512vl(auVar18,auVar47);
          auVar18 = vpslld_avx512vl(auVar18,8);
          auVar26 = vporq_avx512vl(auVar18,auVar26);
          auVar18 = vpsrld_avx512vl(auVar26,2);
          auVar26 = vpand_avx(auVar26,auVar48);
          auVar26 = vpmaddwd_avx(auVar26,auVar49);
          auVar18 = vpandq_avx512vl(auVar18,auVar48);
          auVar18 = vpmaddwd_avx512vl(auVar18,auVar49);
          auVar19 = vpandd_avx512vl(auVar26,auVar50);
          auVar15 = vpaddd_avx512vl(auVar15,auVar19);
          auVar19 = vpsrld_avx512vl(auVar26,4);
          auVar19 = vpandd_avx512vl(auVar19,auVar50);
          auVar14 = vpaddd_avx512vl(auVar14,auVar19);
          auVar19 = vpsrld_avx512vl(auVar26,8);
          auVar26 = vpsrld_avx(auVar26,0xc);
          auVar13 = vpaddd_avx512vl(auVar13,auVar26);
          auVar26 = vpandd_avx512vl(auVar18,auVar50);
          auVar19 = vpandd_avx512vl(auVar19,auVar50);
          auVar12 = vpaddd_avx512vl(auVar12,auVar26);
          auVar26 = vpsrld_avx512vl(auVar18,4);
          auVar8 = vpaddd_avx512vl(auVar8,auVar19);
          auVar26 = vpand_avx(auVar26,auVar50);
          auVar11 = vpaddd_avx512vl(auVar11,auVar26);
          auVar26 = vpsrld_avx512vl(auVar18,8);
          auVar26 = vpand_avx(auVar26,auVar50);
          auVar10 = vpaddd_avx512vl(auVar10,auVar26);
          auVar26 = vpsrld_avx512vl(auVar18,0xc);
          auVar18 = vpxorq_avx512vl(auVar16,auVar43._0_16_);
          auVar9 = vpaddd_avx512vl(auVar9,auVar26);
          auVar26 = vpandq_avx512vl(auVar17,auVar18);
          auVar26 = vpternlogq_avx512vl(auVar26,auVar16,auVar43._0_16_,0xf8);
          auVar55 = ZEXT1664(auVar26);
          auVar26 = vpxorq_avx512vl(auVar17,auVar18);
          auVar43 = ZEXT1664(auVar26);
        } while (uVar4 < uVar6);
        auVar29 = vmovdqa64_avx512f(auVar29);
        auVar26 = vpbroadcastd_avx512vl(ZEXT416(0xf0));
        auVar59 = ZEXT1664(auVar26);
        auVar33 = vpmovsxbq_avx512f(ZEXT816(0x408020100));
        auVar34 = vpmovsxbd_avx512f(_DAT_0011a220);
        auVar35 = vpmovsxbd_avx512f(_DAT_0011a130);
        auVar14 = vpslld_avx512vl(auVar14,4);
        auVar11 = vpslld_avx512vl(auVar11,4);
      }
      else {
        auVar9 = vpxord_avx512vl(auVar8,auVar8);
        auVar10 = vpxord_avx512vl(auVar15,auVar15);
        auVar11 = vpxord_avx512vl(auVar12,auVar12);
        auVar12 = vpxord_avx512vl(auVar13,auVar13);
        auVar13 = vpxord_avx512vl(auVar14,auVar14);
        auVar8 = vpxord_avx512vl(auVar26,auVar26);
        auVar14 = vpxord_avx512vl(auVar17,auVar17);
        auVar15 = vpxord_avx512vl(auVar16,auVar16);
      }
      auVar42 = auVar43._0_16_;
      auVar44 = auVar45._0_16_;
      auVar51 = auVar52._0_16_;
      auVar53 = auVar54._0_16_;
      auVar26 = vpshufb_avx512vl(auVar55._0_16_,auVar1);
      auVar16 = vpsrld_avx512vl(auVar26,1);
      auVar26 = vpandq_avx512vl(auVar26,auVar46);
      auVar16 = vpandq_avx512vl(auVar16,auVar46);
      auVar26 = vpmaddubsw_avx512vl(auVar26,auVar47);
      auVar16 = vpmaddubsw_avx512vl(auVar16,auVar47);
      auVar16 = vpslld_avx512vl(auVar16,8);
      auVar26 = vporq_avx512vl(auVar16,auVar26);
      auVar16 = vpsrld_avx512vl(auVar26,2);
      auVar26 = vpandq_avx512vl(auVar26,auVar48);
      auVar26 = vpmaddwd_avx512vl(auVar26,auVar49);
      auVar16 = vpandq_avx512vl(auVar16,auVar48);
      auVar16 = vpmaddwd_avx512vl(auVar16,auVar49);
      auVar17 = vpandd_avx512vl(auVar26,auVar50);
      auVar15 = vpaddd_avx512vl(auVar15,auVar17);
      auVar17 = vpsrld_avx512vl(auVar26,8);
      auVar17 = vpandd_avx512vl(auVar17,auVar50);
      auVar15 = vpslld_avx512vl(auVar15,4);
      auVar8 = vpaddd_avx512vl(auVar8,auVar17);
      auVar17 = vpsrld_avx512vl(auVar26,0xc);
      auVar13 = vpaddd_avx512vl(auVar13,auVar17);
      auVar17 = vpandd_avx512vl(auVar16,auVar50);
      auVar8 = vpslld_avx512vl(auVar8,4);
      auVar12 = vpaddd_avx512vl(auVar12,auVar17);
      auVar17 = vpsrld_avx512vl(auVar16,8);
      auVar13 = vpslld_avx512vl(auVar13,4);
      auVar57 = ZEXT1664(auVar13);
      auVar13 = vpandd_avx512vl(auVar17,auVar50);
      auVar12 = vpslld_avx512vl(auVar12,4);
      auVar56 = ZEXT1664(auVar12);
      auVar13 = vpaddd_avx512vl(auVar10,auVar13);
      auVar12 = vpsrld_avx512vl(auVar16,0xc);
      auVar12 = vpaddd_avx512vl(auVar9,auVar12);
      auVar26 = vpandd_avx512vl(auVar26,auVar59._0_16_);
      auVar16 = vpandd_avx512vl(auVar16,auVar59._0_16_);
      auVar36 = vpmovsxbd_avx512f(_DAT_0011a230);
      auVar14 = vpaddd_avx512vl(auVar26,auVar14);
      in_ZMM16 = ZEXT1664(auVar14);
      auVar37 = vmovdqa64_avx512f(ZEXT1664(auVar15));
      auVar38 = vpermt2d_avx512f(ZEXT1664(auVar15),auVar30,ZEXT1664(auVar8));
      auVar37 = vpermt2d_avx512f(auVar37,auVar29,ZEXT1664(auVar8));
      auVar8 = vpslld_avx512vl(auVar13,4);
      auVar58 = ZEXT1664(auVar8);
      auVar8 = vpaddd_avx512vl(auVar16,auVar11);
      in_ZMM22 = ZEXT1664(auVar8);
      auVar8 = vpslld_avx512vl(auVar12,4);
      in_ZMM17 = ZEXT1664(auVar8);
      auVar39 = vpmovsxbd_avx512f(_DAT_0011a100);
      auVar40 = vpmovsxbd_avx512f(_DAT_0011a240);
      auVar38 = vpunpcklqdq_avx512f(auVar38,auVar56);
      auVar41 = vmovdqa64_avx512f(auVar56);
      auVar41._0_8_ = auVar37._0_8_;
      auVar41._16_8_ = auVar37._16_8_;
      auVar41._24_8_ = auVar37._24_8_;
      auVar41._32_8_ = auVar37._32_8_;
      auVar41._40_8_ = auVar37._40_8_;
      auVar41._48_8_ = auVar37._48_8_;
      auVar41._56_8_ = auVar37._56_8_;
      auVar37 = vpermt2d_avx512f(auVar38,auVar31,auVar58);
      auVar37 = vinserti32x4_avx512f(auVar37,auVar14,1);
      auVar37 = vpermt2d_avx512f(auVar37,auVar32,auVar57);
      auVar37 = vpermt2q_avx512f(auVar37,auVar33,in_ZMM22);
      auVar37 = vpermt2d_avx512f(auVar37,auVar34,in_ZMM17);
      auVar37 = vpermt2d_avx512f(auVar37,auVar35,auVar56);
      auVar37 = vpermt2d_avx512f(auVar37,auVar39,auVar58);
      auVar38 = vpmovsxbq_avx512f(ZEXT816(0x400090100));
      auVar37 = vpermt2d_avx512f(auVar37,auVar40,in_ZMM16);
      auVar39 = vpmovsxbd_avx512f(_DAT_0011a250);
      auVar36 = vpermt2d_avx512f(auVar37,auVar36,auVar57);
      auVar37 = vpmovsxbd_avx512f(_DAT_0011a260);
      auVar36 = vpermt2d_avx512f(auVar36,auVar39,in_ZMM22);
      auVar36 = vpermt2d_avx512f(auVar36,auVar37,in_ZMM17);
      auVar37 = vpmovsxbd_avx512f(_DAT_0011a270);
      auVar27 = vpaddd_avx512f(auVar27,auVar36);
      in_ZMM21 = vpmovsxbd_avx512f(_DAT_0011a280);
      auVar36 = vmovdqu64_avx512f(auVar27);
      *(undefined1 (*) [64])flags = auVar36;
      auVar36 = vpermt2d_avx512f(auVar41,auVar37,auVar58);
      auVar37 = vpmovsxbd_avx512f(_DAT_0011a290);
      auVar36 = vpermt2q_avx512f(auVar36,auVar38,in_ZMM16);
      auVar38 = vpmovsxbq_avx512f(ZEXT816(0x409020100));
      auVar36 = vpermt2d_avx512f(auVar36,auVar37,auVar57);
      auVar37 = vpmovsxbd_avx512f(_DAT_0011a2a0);
      auVar36 = vpermt2q_avx512f(auVar36,auVar38,in_ZMM22);
      auVar38 = vpmovsxbd_avx512f(_DAT_0011a2b0);
      auVar36 = vpermt2d_avx512f(auVar36,auVar37,in_ZMM17);
      auVar36 = vpermt2d_avx512f(auVar36,auVar38,auVar56);
      auVar37 = vpmovsxbd_avx512f(_DAT_0011a2c0);
      auVar36 = vpermt2d_avx512f(auVar36,in_ZMM21,auVar58);
      in_ZMM20 = vpmovsxbd_avx512f(_DAT_0011a2d0);
      auVar36 = vpermt2d_avx512f(auVar36,in_ZMM20,in_ZMM16);
      auVar36 = vpermt2d_avx512f(auVar36,auVar37,auVar57);
      in_ZMM19 = vpmovsxbd_avx512f(_DAT_0011a150);
      in_ZMM18 = vpmovsxbd_avx512f(_DAT_0011a120);
      auVar36 = vpermt2d_avx512f(auVar36,in_ZMM19,in_ZMM22);
      in_ZMM23 = vpermt2d_avx512f(auVar36,in_ZMM18,in_ZMM17);
      auVar28 = vpaddd_avx512f(auVar28,in_ZMM23);
      auVar36 = vmovdqu64_avx512f(auVar28);
      *(undefined1 (*) [64])(flags + 0x10) = auVar36;
    } while (uVar4 < uVar2);
    vmovdqa64_avx512vl(auVar8);
  }
  auVar27 = vpmovsxbd_avx512f(_DAT_0011a080);
  auVar28 = vpbroadcastd_avx512f(ZEXT416(1));
  auVar30 = vpbroadcastd_avx512f(ZEXT416(0x10));
  lVar3 = 0;
  buffer[0] = auVar53[0];
  buffer[1] = auVar53[1];
  buffer[2] = auVar53[2];
  buffer[3] = auVar53[3];
  do {
    auVar31 = vpbroadcastd_avx512f(ZEXT416(buffer[lVar3]));
    lVar5 = 0;
    auVar32 = vmovdqa64_avx512f(auVar27);
    do {
      auVar29 = vpsrlvd_avx512f(auVar31,auVar32);
      auVar32 = vpaddd_avx512f(auVar32,auVar30);
      auVar29 = vpandd_avx512f(auVar29,auVar28);
      auVar29 = vpaddd_avx512f(auVar29,*(undefined1 (*) [64])(flags + lVar5));
      auVar29 = vmovdqu64_avx512f(auVar29);
      *(undefined1 (*) [64])(flags + lVar5) = auVar29;
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x20);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  auVar27 = vpmovsxbd_avx512f(_DAT_0011a080);
  auVar28 = vpbroadcastd_avx512f(ZEXT416(2));
  lVar3 = 0;
  buffer[0] = auVar51[0];
  buffer[1] = auVar51[1];
  buffer[2] = auVar51[2];
  buffer[3] = auVar51[3];
  do {
    auVar31 = vpbroadcastd_avx512f(ZEXT416(buffer[lVar3]));
    lVar5 = 0;
    auVar32 = vmovdqa64_avx512f(auVar27);
    do {
      auVar29 = vpsrlvd_avx512f(auVar31,auVar32);
      auVar32 = vpaddd_avx512f(auVar32,auVar30);
      auVar29 = vpaddd_avx512f(auVar29,auVar29);
      auVar29 = vpandd_avx512f(auVar29,auVar28);
      auVar29 = vpaddd_avx512f(auVar29,*(undefined1 (*) [64])(flags + lVar5));
      auVar29 = vmovdqu64_avx512f(auVar29);
      *(undefined1 (*) [64])(flags + lVar5) = auVar29;
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x20);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  buffer[0] = auVar44[0];
  buffer[1] = auVar44[1];
  buffer[2] = auVar44[2];
  buffer[3] = auVar44[3];
  auVar27 = vpmovsxbd_avx512f(_DAT_0011a080);
  auVar28 = vpbroadcastd_avx512f(ZEXT416(4));
  lVar3 = 0;
  do {
    auVar31 = vpbroadcastd_avx512f(ZEXT416(buffer[lVar3]));
    lVar5 = 0;
    auVar32 = vmovdqa64_avx512f(auVar27);
    do {
      auVar29 = vpsrlvd_avx512f(auVar31,auVar32);
      auVar32 = vpaddd_avx512f(auVar32,auVar30);
      auVar29 = vpslld_avx512f(auVar29,2);
      auVar29 = vpandd_avx512f(auVar29,auVar28);
      auVar29 = vpaddd_avx512f(auVar29,*(undefined1 (*) [64])(flags + lVar5));
      auVar29 = vmovdqu64_avx512f(auVar29);
      *(undefined1 (*) [64])(flags + lVar5) = auVar29;
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x20);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  buffer[0] = auVar42[0];
  buffer[1] = auVar42[1];
  buffer[2] = auVar42[2];
  buffer[3] = auVar42[3];
  auVar27 = vpmovsxbd_avx512f(_DAT_0011a080);
  auVar28 = vpbroadcastd_avx512f(ZEXT416(8));
  lVar3 = 0;
  do {
    auVar31 = vpbroadcastd_avx512f(ZEXT416(buffer[lVar3]));
    lVar5 = 0;
    auVar32 = vmovdqa64_avx512f(auVar27);
    do {
      auVar29 = vpsrlvd_avx512f(auVar31,auVar32);
      auVar32 = vpaddd_avx512f(auVar32,auVar30);
      auVar29 = vpslld_avx512f(auVar29,3);
      auVar29 = vpandd_avx512f(auVar29,auVar28);
      auVar29 = vpaddd_avx512f(auVar29,*(undefined1 (*) [64])(flags + lVar5));
      auVar29 = vmovdqu64_avx512f(auVar29);
      *(undefined1 (*) [64])(flags + lVar5) = auVar29;
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x20);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  return;
}

Assistant:

void pospopcnt_u32_sse_harley_seal_improved(const uint32_t* array, size_t len, uint32_t* flags) {
    for (size_t i = len - (len % (16 * 4)); i < len; ++i) {
        for (int j = 0; j < 32; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

    const __m128i* data = (const __m128i*)array;
    size_t size = len / 4;
    __m128i v1  = _mm_setzero_si128();
    __m128i v2  = _mm_setzero_si128();
    __m128i v4  = _mm_setzero_si128();
    __m128i v8  = _mm_setzero_si128();
    __m128i v16 = _mm_setzero_si128();
    __m128i twosA, twosB, foursA, foursB, eightsA, eightsB;

    const uint64_t limit = size - size % 16;
    uint64_t i = 0;
    uint32_t buffer[4];
    __m128i counter[8];

    const __m128i lookup = _mm_setr_epi8( 0,  4,  8, 12,
                                          1,  5,  9, 13,
                                          2,  6, 10, 14,
                                          3,  7, 11, 15);

    while (i < limit) {
        for (size_t i = 0; i < 8; ++i) {
            counter[i] = _mm_setzero_si128();
        }

        size_t thislimit = limit;
        if (thislimit - i >= (1 << 16))
            thislimit = i + (1 << 16) - 1;

        for (/**/; i < thislimit; i += 16) {
            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i +  0), _mm_loadu_si128(data + i +  1));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i +  2), _mm_loadu_si128(data + i +  3));
            pospopcnt_csa_sse(&foursA, &v2, twosA, twosB);
            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i +  4), _mm_loadu_si128(data + i +  5));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i +  6), _mm_loadu_si128(data + i +  7));
            pospopcnt_csa_sse(&foursB, &v2, twosA, twosB);
            pospopcnt_csa_sse(&eightsA,&v4, foursA, foursB);
            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i +  8),  _mm_loadu_si128(data + i +  9));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i + 10),  _mm_loadu_si128(data + i + 11));
            pospopcnt_csa_sse(&foursA, &v2, twosA, twosB);
            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i + 12),  _mm_loadu_si128(data + i + 13));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i + 14),  _mm_loadu_si128(data + i + 15));
            pospopcnt_csa_sse(&foursB, &v2, twosA, twosB);
            pospopcnt_csa_sse(&eightsB,&v4, foursA, foursB);

            {
                const __m128i t0 = _mm_shuffle_epi8(v16, lookup);
                const __m128i m0 = _mm_and_si128(t0, _mm_set1_epi8(0x55));
                const __m128i m1 = _mm_and_si128(_mm_srli_epi32(t0, 1), _mm_set1_epi8(0x55));

                const __m128i s0 = _mm_maddubs_epi16(m0, _mm_set1_epi16(0x0101));
                const __m128i s1 = _mm_maddubs_epi16(m1, _mm_set1_epi16(0x0101));

                const __m128i t1 = _mm_or_si128(s0, _mm_slli_epi32(s1, 8));

                const __m128i n0 = _mm_and_si128(t1, _mm_set1_epi8(0x33));
                const __m128i n1 = _mm_and_si128(_mm_srli_epi32(t1, 2), _mm_set1_epi8(0x33));

                const __m128i S0 = _mm_madd_epi16(n0, _mm_set1_epi32(0x00010001));
                const __m128i S1 = _mm_madd_epi16(n1, _mm_set1_epi32(0x00010001));

                const __m128i mask = _mm_set1_epi32(0x0000000f);
                counter[0] = _mm_add_epi32(counter[0], _mm_and_si128(S0, mask));
                counter[1] = _mm_add_epi32(counter[1], _mm_and_si128(_mm_srli_epi32(S0,  4), mask));
                counter[2] = _mm_add_epi32(counter[2], _mm_and_si128(_mm_srli_epi32(S0,  8), mask));
                counter[3] = _mm_add_epi32(counter[3], _mm_and_si128(_mm_srli_epi32(S0, 12), mask));
                counter[4] = _mm_add_epi32(counter[4], _mm_and_si128(S1, mask));
                counter[5] = _mm_add_epi32(counter[5], _mm_and_si128(_mm_srli_epi32(S1,  4), mask));
                counter[6] = _mm_add_epi32(counter[6], _mm_and_si128(_mm_srli_epi32(S1,  8), mask));
                counter[7] = _mm_add_epi32(counter[7], _mm_and_si128(_mm_srli_epi32(S1, 12), mask));
            }

            pospopcnt_csa_sse(&v16,    &v8, eightsA, eightsB);
        }

        // update the counters after the last iteration
        {
            const __m128i t0 = _mm_shuffle_epi8(v16, lookup);

            const __m128i m0 = _mm_and_si128(t0, _mm_set1_epi8(0x55));
            const __m128i m1 = _mm_and_si128(_mm_srli_epi32(t0, 1), _mm_set1_epi8(0x55));

            const __m128i s0 = _mm_maddubs_epi16(m0, _mm_set1_epi16(0x0101));
            const __m128i s1 = _mm_maddubs_epi16(m1, _mm_set1_epi16(0x0101));

            const __m128i t1 = _mm_or_si128(s0, _mm_slli_epi32(s1, 8));

            const __m128i n0 = _mm_and_si128(t1, _mm_set1_epi8(0x33));
            const __m128i n1 = _mm_and_si128(_mm_srli_epi32(t1, 2), _mm_set1_epi8(0x33));

            const __m128i S0 = _mm_madd_epi16(n0, _mm_set1_epi32(0x00010001));
            const __m128i S1 = _mm_madd_epi16(n1, _mm_set1_epi32(0x00010001));

            const __m128i mask = _mm_set1_epi32(0x0000000f);
            counter[0] = _mm_add_epi32(counter[0], _mm_and_si128(S0, mask));
            counter[1] = _mm_add_epi32(counter[1], _mm_and_si128(_mm_srli_epi32(S0,  4), mask));
            counter[2] = _mm_add_epi32(counter[2], _mm_and_si128(_mm_srli_epi32(S0,  8), mask));
            counter[3] = _mm_add_epi32(counter[3], _mm_and_si128(_mm_srli_epi32(S0, 12), mask));
            counter[4] = _mm_add_epi32(counter[4], _mm_and_si128(S1, mask));
            counter[5] = _mm_add_epi32(counter[5], _mm_and_si128(_mm_srli_epi32(S1,  4), mask));
            counter[6] = _mm_add_epi32(counter[6], _mm_and_si128(_mm_srli_epi32(S1,  8), mask));
            counter[7] = _mm_add_epi32(counter[7], _mm_and_si128(_mm_srli_epi32(S1, 12), mask));

#define update_flags(counterN, index0, index1, index2, index3)      \
            _mm_storeu_si128((__m128i*)buffer, _mm_slli_epi32(counterN, 4));           \
            flags[index0] += buffer[0]; flags[index1] += buffer[1]; \
            flags[index2] += buffer[2]; flags[index3] += buffer[3];

            update_flags(counter[0], 0,  8, 16, 24);
            update_flags(counter[1], 4, 12, 20, 28);
            update_flags(counter[2], 1,  9, 17, 25);
            update_flags(counter[3], 5, 13, 21, 29);
            update_flags(counter[4], 2, 10, 18, 26);
            update_flags(counter[5], 6, 14, 22, 30);
            update_flags(counter[6], 3, 11, 19, 27);
            update_flags(counter[7], 7, 15, 23, 31);
#undef update_flags
        }
    }

    _mm_storeu_si128((__m128i*)buffer, v1);
    for (size_t i = 0; i < 4; ++i) {
        for (int j = 0; j < 32; ++j) {
            flags[j] += ((buffer[i] & (1 << j)) >> j);
        }
    }

    _mm_storeu_si128((__m128i*)buffer, v2);
    for (size_t i = 0; i < 4; ++i) {
        for (int j = 0; j < 32; ++j) {
            flags[j] += 2 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    _mm_storeu_si128((__m128i*)buffer, v4);
    for (size_t i = 0; i < 4; ++i) {
        for (int j = 0; j < 32; ++j) {
            flags[j] += 4 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    _mm_storeu_si128((__m128i*)buffer, v8);
    for (size_t i = 0; i < 4; ++i) {
        for (int j = 0; j < 32; ++j) {
            flags[j] += 8 * ((buffer[i] & (1 << j)) >> j);
        }
    }
}